

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t s;
  
  printf("Enter an amount of seconds: ");
  __isoc99_scanf("%lu",&s);
  uVar1 = s / 0x3c;
  uVar3 = s % 0x3c;
  uVar2 = s / 0xe10;
  s = uVar3;
  printf("This is equal to %lu hours, %lu minutes and %lu seconds\n",uVar2,uVar1 % 0x3c,uVar3);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  uint64_t s;
  printf("Enter an amount of seconds: ");
  scanf("%" SCNu64, &s);
  // If s was an `int`, you could've written:
  // scanf("%d", &s);

  uint64_t m = s / 60;
  s %= 60;

  uint64_t h = m / 60;
  m %= 60;

  printf("This is equal to %" PRIu64 " hours, %" PRIu64 " minutes and %" PRIu64 " seconds\n", h, m, s);
  // If s, m and h were `int`s, you could've written:
  // printf("This is equal to %d hours, %d minutes and %d seconds\n", h, m, s);

  return 0;
}